

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O2

void remove_damage(monst *shkp,boolean croaked)

{
  char y;
  level *lev;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  xchar xVar6;
  boolean bVar7;
  char cVar8;
  byte bVar9;
  char cVar10;
  uint uVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  damage *pdVar15;
  int y_00;
  int x;
  damage *tmp_dam;
  char shops [5];
  
  xVar6 = ledger_no((d_level *)&shkp[0x1b].mxlth);
  lev = levels[xVar6];
  tmp_dam = lev->damagelist;
  bVar3 = false;
  bVar4 = false;
  cVar8 = '\0';
  bVar2 = false;
  bVar9 = 0;
  bVar1 = false;
  do {
    pdVar15 = (damage *)0x0;
LAB_002297c5:
    if (tmp_dam == (damage *)0x0) {
      if (!bVar1) {
        return;
      }
      if (bVar9 == 0) {
        if (bVar3) {
          pcVar12 = "Suddenly, the shop door reappears!";
        }
        else if (bVar4) {
          pcVar12 = "Suddenly, the floor damage is gone!";
        }
        else if (bVar2) {
          pcVar12 = "Suddenly, the trap is removed from the floor!";
        }
        else {
          cVar10 = inside_shop(level,u.ux,u.uy);
          if (cVar10 != (char)shkp[0x1b].meating) {
            if ((flags.soundok != '\0') && (uVar11 = mt_random(), uVar11 % 10 == 0)) {
              Norep("The dungeon acoustics noticeably change.");
            }
            goto LAB_002299f3;
          }
          pcVar12 = "You feel more claustrophobic than before.";
        }
      }
      else {
        if (bVar9 == 1) {
          pcVar12 = "a";
          pcVar14 = "";
          pcVar13 = "s";
        }
        else {
          pcVar12 = "several";
          if (bVar9 < 4) {
            pcVar12 = "some";
          }
          pcVar14 = "s";
          pcVar13 = "";
        }
        pline("Suddenly, %s section%s of wall close%s up!",pcVar12,pcVar14,pcVar13);
        if (bVar3) {
          pline("The shop door reappears!");
        }
        if (!bVar4) goto LAB_002299f3;
        pcVar12 = "The floor is repaired!";
      }
      pline(pcVar12);
LAB_002299f3:
      if (cVar8 != '\0') {
        stop_occupation();
      }
      return;
    }
    cVar10 = (tmp_dam->place).x;
    x = (int)cVar10;
    y = (tmp_dam->place).y;
    y_00 = (int)y;
    pcVar12 = in_rooms(lev,cVar10,y,0x12);
    strcpy(shops,pcVar12);
    pcVar12 = strchr(shops,(int)(char)shkp[0x1b].meating);
    if (pcVar12 == (char *)0x0) {
LAB_0022988e:
      pdVar15 = tmp_dam;
      tmp_dam = tmp_dam->next;
      goto LAB_002297c5;
    }
    if (croaked == '\0') {
      if (cVar8 == '\0') {
        bVar7 = closed_door(lev,x,y_00);
        if (bVar7 == '\0') {
          cVar8 = '\0';
        }
        else {
          cVar8 = picking_at(x,y_00);
        }
        uVar11 = repair_damage(lev,shkp,tmp_dam,'\0');
        if (uVar11 == 0) {
          cVar8 = '\0';
        }
      }
      else {
        uVar11 = repair_damage(lev,shkp,tmp_dam,'\0');
      }
    }
    else {
      uVar11 = (uint)(shops[1] == '\0');
    }
    bVar5 = bVar4;
    if (uVar11 != 1) {
      if (uVar11 == 0) goto LAB_0022988e;
      bVar1 = true;
      if ((viz_array[y_00][x] & 2U) != 0) {
        cVar10 = lev->locations[x][y_00].typ;
        if (cVar10 < '\r' && cVar10 != '\0') {
          bVar9 = bVar9 + 1;
        }
        else {
          bVar1 = true;
          if (cVar10 == '\x17') {
            bVar3 = true;
          }
          else {
            bVar5 = true;
            if (uVar11 == 3) {
              bVar2 = true;
              bVar5 = bVar4;
            }
          }
        }
      }
    }
    bVar4 = bVar5;
    tmp_dam = tmp_dam->next;
    if (pdVar15 != (damage *)0x0) {
      free(pdVar15->next);
      pdVar15->next = tmp_dam;
      goto LAB_002297c5;
    }
    free(lev->damagelist);
    lev->damagelist = tmp_dam;
  } while( true );
}

Assistant:

static void remove_damage(struct monst *shkp, boolean croaked)
{
	struct damage *tmp_dam, *tmp2_dam;
	boolean did_repair = FALSE, saw_door = FALSE;
	boolean saw_floor = FALSE, stop_picking = FALSE;
	boolean saw_untrap = FALSE;
	uchar saw_walls = 0;
	struct level *lev = levels[ledger_no(&ESHK(shkp)->shoplevel)];

	tmp_dam = lev->damagelist;
	tmp2_dam = 0;
	while (tmp_dam) {
	    xchar x = tmp_dam->place.x, y = tmp_dam->place.y;
	    char shops[5];
	    int disposition;

	    disposition = 0;
	    strcpy(shops, in_rooms(lev, x, y, SHOPBASE));
	    if (strchr(shops, ESHK(shkp)->shoproom)) {
		if (croaked)
		    disposition = (shops[1])? 0 : 1;
		else if (stop_picking)
		    disposition = repair_damage(lev, shkp, tmp_dam, FALSE);
		else {
		    /* Defer the stop_occupation() until after repair msgs */
		    if (closed_door(lev, x, y))
			stop_picking = picking_at(x, y);
		    disposition = repair_damage(lev, shkp, tmp_dam, FALSE);
		    if (!disposition)
			stop_picking = FALSE;
		}
	    }

	    if (!disposition) {
		tmp2_dam = tmp_dam;
		tmp_dam = tmp_dam->next;
		continue;
	    }

	    if (disposition > 1) {
		did_repair = TRUE;
		if (cansee(x, y)) {
		    if (IS_WALL(lev->locations[x][y].typ))
			saw_walls++;
		    else if (IS_DOOR(lev->locations[x][y].typ))
			saw_door = TRUE;
		    else if (disposition == 3)		/* untrapped */
			saw_untrap = TRUE;
		    else
			saw_floor = TRUE;
		}
	    }

	    tmp_dam = tmp_dam->next;
	    if (!tmp2_dam) {
		free(lev->damagelist);
		lev->damagelist = tmp_dam;
	    } else {
		free(tmp2_dam->next);
		tmp2_dam->next = tmp_dam;
	    }
	}
	if (!did_repair)
	    return;
	if (saw_walls) {
	    pline("Suddenly, %s section%s of wall close%s up!",
		  (saw_walls == 1) ? "a" : (saw_walls <= 3) ?
						  "some" : "several",
		  (saw_walls == 1) ? "" : "s", (saw_walls == 1) ? "s" : "");
	    if (saw_door)
		pline("The shop door reappears!");
	    if (saw_floor)
		pline("The floor is repaired!");
	} else {
	    if (saw_door)
		pline("Suddenly, the shop door reappears!");
	    else if (saw_floor)
		pline("Suddenly, the floor damage is gone!");
	    else if (saw_untrap)
	        pline("Suddenly, the trap is removed from the floor!");
	    else if (inside_shop(level, u.ux, u.uy) == ESHK(shkp)->shoproom)
		pline("You feel more claustrophobic than before.");
	    else if (flags.soundok && !rn2(10))
		Norep("The dungeon acoustics noticeably change.");
	}
	if (stop_picking)
		stop_occupation();
}